

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceAllocator
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(this->descriptor_ + 0x2c); lVar3 = lVar3 + 1) {
    pFVar1 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar2));
    (*pFVar1->_vptr_FieldGenerator[0x11])(pFVar1,printer);
    lVar2 = lVar2 + 0xa8;
  }
  io::Printer::Print(printer,"_$classname$_default_instance_.DefaultConstruct();\n","classname",
                     &this->classname_);
  return;
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceAllocator(io::Printer* printer) {
  // Construct the default instances of all fields, as they will be used
  // when creating the default instance of the entire message.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateDefaultInstanceAllocator(printer);
  }

  // Construct the default instance.  We can't call InitAsDefaultInstance() yet
  // because we need to make sure all default instances that this one might
  // depend on are constructed first.
  printer->Print("_$classname$_default_instance_.DefaultConstruct();\n",
                 "classname", classname_);
}